

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderFragDataTests.cpp
# Opt level: O3

bool deqp::gles3::Functional::anon_unknown_0::compareSingleColor
               (TestLog *log,Surface *surface,RGBA expectedColor,RGBA threshold)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  void *__buf;
  int iVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int local_21c;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  undefined1 local_1a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  local_1b0 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Expecting ",10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"RGBA(",5);
  poVar5 = (ostream *)
           std::ostream::operator<<((ostringstream *)local_1a8,expectedColor.m_value & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  uVar11 = expectedColor.m_value >> 8 & 0xff;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  uVar12 = expectedColor.m_value >> 0x10 & 0xff;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar12);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,expectedColor.m_value >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," with threshold ",0x10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"RGBA(",5);
  poVar5 = (ostream *)std::ostream::operator<<((ostringstream *)local_1a8,threshold.m_value & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,threshold.m_value >> 8 & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,threshold.m_value >> 0x10 & 0xff);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,threshold.m_value >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  iVar13 = surface->m_height;
  if (0 < iVar13) {
    iVar4 = surface->m_width;
    local_21c = 0;
    iVar10 = 0;
    do {
      if (0 < iVar4) {
        iVar13 = 0;
        do {
          uVar1 = *(uint *)((long)(surface->m_pixels).m_ptr + (long)(iVar4 * local_21c + iVar13) * 4
                           );
          if (uVar1 != expectedColor.m_value) {
            uVar6 = (uVar1 & 0xff) - (expectedColor.m_value & 0xff);
            uVar2 = -uVar6;
            if (0 < (int)uVar6) {
              uVar2 = uVar6;
            }
            uVar6 = uVar1 >> 8 & 0xff;
            iVar7 = uVar6 - uVar11;
            iVar4 = -iVar7;
            if (0 < iVar7) {
              iVar4 = iVar7;
            }
            uVar14 = uVar1 >> 0x10 & 0xff;
            iVar8 = uVar14 - uVar12;
            iVar7 = -iVar8;
            if (0 < iVar8) {
              iVar7 = iVar8;
            }
            iVar9 = (uVar1 >> 0x18) - (expectedColor.m_value >> 0x18);
            iVar8 = -iVar9;
            if (0 < iVar9) {
              iVar8 = iVar9;
            }
            local_1b0._0_4_ = iVar7 << 0x10 | iVar4 << 8 | iVar8 << 0x18 | uVar2;
            bVar3 = tcu::RGBA::isBelowThreshold((RGBA *)local_1b0,threshold);
            if (!bVar3) {
              if (iVar10 < 10) {
                local_1b0 = (undefined1  [8])log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"ERROR: Got ",0xb);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"RGBA(",5);
                poVar5 = (ostream *)std::ostream::operator<<(local_1a8,uVar1 & 0xff);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar6);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar14);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
                poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar1 >> 0x18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," at (",5);
                std::ostream::operator<<(local_1a8,iVar13);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
                std::ostream::operator<<(local_1a8,local_21c);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,")!",2);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
              }
              else if (iVar10 == 10) {
                local_1b0 = (undefined1  [8])log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"...",3);
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                std::ios_base::~ios_base(local_138);
              }
              iVar10 = iVar10 + 1;
            }
          }
          iVar13 = iVar13 + 1;
          iVar4 = surface->m_width;
        } while (iVar13 < iVar4);
        iVar13 = surface->m_height;
      }
      local_21c = local_21c + 1;
    } while (local_21c < iVar13);
    if (0 < iVar10) {
      local_1b0 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Found ",6);
      std::ostream::operator<<((ostringstream *)local_1a8,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8," invalid pixels, comparison FAILED!",0x23);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"ResultImage","");
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"Result Image","");
      tcu::LogImage::LogImage
                ((LogImage *)local_1b0,&local_1d0,&local_1f0,surface,QP_IMAGE_COMPRESSION_MODE_BEST)
      ;
      tcu::LogImage::write((LogImage *)local_1b0,(int)log,__buf,(size_t)surface);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != local_180) {
        operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
      }
      if (local_1b0 != (undefined1  [8])(local_1a8 + 8)) {
        operator_delete((void *)local_1b0,local_1a0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      return false;
    }
  }
  local_1b0 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Image comparison passed.",0x18);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return true;
}

Assistant:

static bool compareSingleColor (tcu::TestLog& log, const tcu::Surface& surface, tcu::RGBA expectedColor, tcu::RGBA threshold)
{
	const int	maxPrints			= 10;
	int			numFailedPixels		= 0;

	log << TestLog::Message << "Expecting " << expectedColor << " with threshold " << threshold << TestLog::EndMessage;

	for (int y = 0; y < surface.getHeight(); y++)
	{
		for (int x = 0; x < surface.getWidth(); x++)
		{
			const tcu::RGBA		resultColor		= surface.getPixel(x, y);
			const bool			isOk			= compareThreshold(resultColor, expectedColor, threshold);

			if (!isOk)
			{
				if (numFailedPixels < maxPrints)
					log << TestLog::Message << "ERROR: Got " << resultColor << " at (" << x << ", " << y << ")!" << TestLog::EndMessage;
				else if (numFailedPixels == maxPrints)
					log << TestLog::Message << "..." << TestLog::EndMessage;

				numFailedPixels += 1;
			}
		}
	}

	if (numFailedPixels > 0)
	{
		log << TestLog::Message << "Found " << numFailedPixels << " invalid pixels, comparison FAILED!" << TestLog::EndMessage;
		log << TestLog::Image("ResultImage", "Result Image", surface);
		return false;
	}
	else
	{
		log << TestLog::Message << "Image comparison passed." << TestLog::EndMessage;
		return true;
	}
}